

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O0

void * TPZStructMatrixOT<std::complex<double>_>::ThreadData::ThreadWork(void *datavoid)

{
  TPZCompEl *pTVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  int64_t iVar5;
  long *plVar6;
  TPZCompEl **ppTVar7;
  TPZGuiInterface *this;
  TPZFMatrix<std::complex<double>_> *pTVar8;
  TPZVec<long> *source;
  long lVar9;
  undefined8 *in_RDI;
  bool elementcompletedupdate;
  int64_t localcompleted;
  bool localupdated;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> lock_2;
  bool elementcompletedupdate_1;
  TPZFMatrix<std::complex<double>_> *globRhs;
  TPZMatrix<std::complex<double>_> *globMatrix;
  unique_lock<std::mutex> lock_1;
  bool hadtowait;
  int64_t needscomputed;
  bool localupdated_1;
  int64_t localcompleted_1;
  TPZCompEl *el;
  int64_t iel;
  int64_t index;
  int64_t numelements;
  TPZElementMatrixT<std::complex<double>_> ef;
  TPZElementMatrixT<std::complex<double>_> ek;
  TPZAutoPointer<TPZGuiInterface> guiInterface;
  TPZCompMesh *cmesh;
  int *SomeoneIsSleeping;
  TPZVec<long> *ElBlocked;
  TPZVec<long> *ComputedElements;
  ThreadData *data;
  TPZVec<long> *in_stack_fffffffffffefa58;
  undefined7 in_stack_fffffffffffefa60;
  undefined1 in_stack_fffffffffffefa67;
  TPZElementMatrix *in_stack_fffffffffffefa68;
  long *in_stack_fffffffffffefa78;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffefa80;
  undefined8 in_stack_fffffffffffefa90;
  MType type;
  undefined6 in_stack_fffffffffffefa98;
  undefined1 in_stack_fffffffffffefa9e;
  undefined1 in_stack_fffffffffffefa9f;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffefaa0;
  TPZFMatrix<std::complex<double>_> *rhs;
  TPZFMatrix<std::complex<double>_> *pTVar10;
  TPZElementMatrix *in_stack_fffffffffffefb30;
  long lStack_10460;
  _func_int **pp_Stack_10448;
  undefined1 auStack_10438 [688];
  size_t in_stack_fffffffffffefe78;
  char *in_stack_fffffffffffefe80;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffefea0;
  undefined1 local_8258 [248];
  undefined1 local_8160 [112];
  undefined1 local_80f0 [136];
  undefined1 local_8068 [16368];
  undefined1 local_4078 [16368];
  TPZAutoPointer<TPZGuiInterface> local_88;
  TPZCompMesh *local_80;
  int *local_78;
  TPZVec<long> *local_70;
  TPZVec<long> *local_68;
  undefined8 *local_60;
  _func_int **local_50;
  undefined8 local_48;
  undefined4 local_3c;
  undefined8 local_38;
  TPZElementMatrix *local_30;
  _func_int **local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  long *local_8;
  
  type = (MType)((ulong)in_stack_fffffffffffefa90 >> 0x20);
  local_68 = (TPZVec<long> *)in_RDI[6];
  local_70 = (TPZVec<long> *)in_RDI[0x13];
  local_78 = (int *)in_RDI[0x12];
  local_60 = in_RDI;
  local_80 = ::TPZStructMatrix::Mesh((TPZStructMatrix *)*in_RDI);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             CONCAT17(in_stack_fffffffffffefa67,in_stack_fffffffffffefa60),
             (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffefa58);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (in_stack_fffffffffffefaa0,
             (TPZCompMesh *)
             CONCAT17(in_stack_fffffffffffefa9f,
                      CONCAT16(in_stack_fffffffffffefa9e,in_stack_fffffffffffefa98)),type);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (in_stack_fffffffffffefaa0,
             (TPZCompMesh *)
             CONCAT17(in_stack_fffffffffffefa9f,
                      CONCAT16(in_stack_fffffffffffefa9e,in_stack_fffffffffffefa98)),type);
  iVar5 = TPZVec<long>::size((TPZVec<long> *)local_60[0x14]);
  local_8 = (long *)local_60[4];
  local_10 = 1;
  local_14 = 5;
  local_20 = 1;
  LOCK();
  pp_Stack_10448 = (_func_int **)*local_8;
  *local_8 = *local_8 + 1;
  UNLOCK();
  local_28 = pp_Stack_10448;
  while ((long)pp_Stack_10448 < iVar5) {
    plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)local_60[0x14],(int64_t)pp_Stack_10448);
    if (*plVar6 < 0) {
      std::operator<<((ostream *)&std::cout,"the element in ElColorSequence is negative???\n");
      pzinternal::DebugStopImpl(in_stack_fffffffffffefe80,in_stack_fffffffffffefe78);
    }
    else {
      TPZCompMesh::ElementVec(local_80);
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (in_stack_fffffffffffefa80,(int64_t)in_stack_fffffffffffefa78);
      pTVar1 = *ppTVar7;
      (**(code **)(*(long *)pTVar1 + 0x110))(pTVar1,local_8258,auStack_10438);
      bVar2 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&local_88);
      if (bVar2) {
        this = TPZAutoPointer<TPZGuiInterface>::operator->(&local_88);
        bVar2 = TPZGuiInterface::AmIKilled(this);
        if (bVar2) break;
      }
      iVar4 = (**(code **)(*(long *)pTVar1 + 0x1f0))();
      if (iVar4 == 0) {
        TPZElementMatrix::ComputeDestinationIndices(in_stack_fffffffffffefb30);
        ::TPZStructMatrix::FilterEquations
                  ((TPZStructMatrix *)CONCAT17(in_stack_fffffffffffefa67,in_stack_fffffffffffefa60),
                   in_stack_fffffffffffefa58,(TPZVec<long> *)0x1d88dc3);
      }
      else {
        TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(in_stack_fffffffffffefea0);
        TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(in_stack_fffffffffffefea0);
        TPZElementMatrix::ComputeDestinationIndices(in_stack_fffffffffffefb30);
        ::TPZStructMatrix::FilterEquations
                  ((TPZStructMatrix *)CONCAT17(in_stack_fffffffffffefa67,in_stack_fffffffffffefa60),
                   in_stack_fffffffffffefa58,(TPZVec<long> *)0x1d88e14);
      }
      lStack_10460 = *(long *)local_60[0x15];
      while( true ) {
        bVar2 = false;
        if (lStack_10460 < iVar5 + -1) {
          plVar6 = TPZVec<long>::operator[](local_68,lStack_10460 + 1);
          bVar2 = *plVar6 == 1;
        }
        if (!bVar2) break;
        lStack_10460 = lStack_10460 + 1;
      }
      plVar6 = TPZVec<long>::operator[](local_70,(int64_t)pp_Stack_10448);
      lVar9 = *plVar6;
      while (lStack_10460 < lVar9) {
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)
                   CONCAT17(in_stack_fffffffffffefa67,in_stack_fffffffffffefa60),
                   (mutex_type *)in_stack_fffffffffffefa58);
        *local_78 = 1;
        std::condition_variable::wait((unique_lock *)(local_60 + 0xc));
        lStack_10460 = *(long *)local_60[0x15];
        while (plVar6 = TPZVec<long>::operator[](local_68,lStack_10460 + 1), *plVar6 == 1) {
          lStack_10460 = lStack_10460 + 1;
        }
        std::unique_lock<std::mutex>::~unique_lock
                  ((unique_lock<std::mutex> *)
                   CONCAT17(in_stack_fffffffffffefa67,in_stack_fffffffffffefa60));
      }
      if (local_60[2] == 0) {
        pTVar8 = (TPZFMatrix<std::complex<double>_> *)0x0;
      }
      else {
        pTVar8 = (TPZFMatrix<std::complex<double>_> *)
                 __dynamic_cast(local_60[2],&TPZBaseMatrix::typeinfo,
                                &TPZMatrix<std::complex<double>>::typeinfo,0);
      }
      rhs = (TPZFMatrix<std::complex<double>_> *)local_60[3];
      pTVar10 = pTVar8;
      if (rhs == (TPZFMatrix<std::complex<double>_> *)0x0) {
        source = (TPZVec<long> *)0x0;
      }
      else {
        source = (TPZVec<long> *)
                 __dynamic_cast(rhs,&TPZBaseMatrix::typeinfo,
                                &TPZFMatrix<std::complex<double>>::typeinfo,0);
      }
      if (pTVar8 != (TPZFMatrix<std::complex<double>_> *)0x0) {
        uVar3 = TPZElementMatrix::HasDependency(in_stack_fffffffffffefa68);
        if ((bool)uVar3) {
          (*(pTVar8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x34])(pTVar8,local_4078,local_80f0,local_8160);
          if ((*(byte *)(local_60 + 0x16) & 1) != 0) {
            TPZFMatrix<std::complex<double>_>::AddFel
                      (pTVar10,rhs,source,
                       (TPZVec<long> *)
                       CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffefa9e,in_stack_fffffffffffefa98))
                      );
          }
        }
        else {
          (*(pTVar8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x34])(pTVar8,local_8068,local_80f0,local_8160);
          if ((*(byte *)(local_60 + 0x16) & 1) != 0) {
            TPZFMatrix<std::complex<double>_>::AddFel
                      (pTVar10,rhs,source,
                       (TPZVec<long> *)
                       CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffefa9e,in_stack_fffffffffffefa98))
                      );
          }
        }
      }
      while( true ) {
        bVar2 = false;
        if (lStack_10460 < iVar5 + -1) {
          plVar6 = TPZVec<long>::operator[](local_68,lStack_10460 + 1);
          bVar2 = *plVar6 == 1;
        }
        if (!bVar2) break;
        lStack_10460 = lStack_10460 + 1;
      }
      if (lStack_10460 == (long)pp_Stack_10448 + -1) {
        lStack_10460 = lStack_10460 + 1;
      }
      in_stack_fffffffffffefa9e = 0;
      while( true ) {
        bVar2 = false;
        if (lStack_10460 < iVar5 + -1) {
          in_stack_fffffffffffefa80 =
               (TPZChunkVector<TPZCompEl_*,_10> *)
               TPZVec<long>::operator[](local_68,lStack_10460 + 1);
          bVar2 = (in_stack_fffffffffffefa80->super_TPZSavable)._vptr_TPZSavable ==
                  (_func_int **)0x1;
        }
        if (!bVar2) break;
        lStack_10460 = lStack_10460 + 1;
      }
      if (*(long *)local_60[0x15] < lStack_10460) {
        *(long *)local_60[0x15] = lStack_10460;
      }
      in_stack_fffffffffffefa78 = TPZVec<long>::operator[](local_68,(int64_t)pp_Stack_10448);
      *in_stack_fffffffffffefa78 = 1;
      if (*local_78 != 0) {
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)
                   CONCAT17(in_stack_fffffffffffefa67,in_stack_fffffffffffefa60),
                   (mutex_type *)in_stack_fffffffffffefa58);
        *local_78 = 0;
        std::condition_variable::notify_all();
        std::unique_lock<std::mutex>::~unique_lock
                  ((unique_lock<std::mutex> *)
                   CONCAT17(in_stack_fffffffffffefa67,in_stack_fffffffffffefa60));
      }
    }
    in_stack_fffffffffffefa68 = (TPZElementMatrix *)local_60[4];
    local_38 = 1;
    local_3c = 5;
    local_48 = 1;
    LOCK();
    pp_Stack_10448 = in_stack_fffffffffffefa68->_vptr_TPZElementMatrix;
    in_stack_fffffffffffefa68->_vptr_TPZElementMatrix =
         (_func_int **)((long)in_stack_fffffffffffefa68->_vptr_TPZElementMatrix + 1);
    UNLOCK();
    local_50 = pp_Stack_10448;
    local_30 = in_stack_fffffffffffefa68;
  }
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_fffffffffffefa67,in_stack_fffffffffffefa60),
             (mutex_type *)in_stack_fffffffffffefa58);
  lVar9 = *(long *)local_60[0x15];
  while( true ) {
    uVar3 = false;
    if (lVar9 < iVar5 + -1) {
      plVar6 = TPZVec<long>::operator[](local_68,lVar9 + 1);
      uVar3 = *plVar6 == 1;
    }
    if ((bool)uVar3 == false) break;
    lVar9 = lVar9 + 1;
  }
  if (lVar9 == (long)pp_Stack_10448 + -1) {
    lVar9 = lVar9 + 1;
  }
  if (*(long *)local_60[0x15] < lVar9) {
    *(long *)local_60[0x15] = lVar9;
  }
  std::condition_variable::notify_all();
  *local_78 = 0;
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT17(uVar3,in_stack_fffffffffffefa60));
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT
            ((TPZElementMatrixT<std::complex<double>_> *)CONCAT17(uVar3,in_stack_fffffffffffefa60));
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT
            ((TPZElementMatrixT<std::complex<double>_> *)CONCAT17(uVar3,in_stack_fffffffffffefa60));
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)CONCAT17(uVar3,in_stack_fffffffffffefa60));
  return (void *)0x0;
}

Assistant:

void *TPZStructMatrixOT<TVar>::ThreadData::ThreadWork(void *datavoid)
{
    ThreadData *data = (ThreadData *) datavoid;
//    TPZStructMatrixOT *strmat = data->fStruct;
    TPZVec<int64_t> &ComputedElements = *(data->fComputedElements);
    TPZVec<int64_t> &ElBlocked = *(data->fElBlocked);

    int &SomeoneIsSleeping = *(data->fSomeoneIsSleeping);
    
    TPZCompMesh *cmesh = data->fStruct->Mesh();
    TPZAutoPointer<TPZGuiInterface> guiInterface = data->fGuiInterface;
    TPZElementMatrixT<TVar> ek(cmesh,TPZElementMatrix::EK);
    TPZElementMatrixT<TVar> ef(cmesh,TPZElementMatrix::EF);
    int64_t numelements = data->fElSequenceColor->size();
    int64_t index = data->fCurrentIndex->fetch_add(1);
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "ThreadData starting with " << data->fThreadSeqNum << " total elements " << numelements << std::endl;
        sout << "index = " << index << std::endl;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    
#ifdef HUGEDEBUG
    data->fMutexAccessElement.lock();
    std::cout << "ThreadData starting with " << data->fThreadSeqNum << " total elements " << numelements << std::endl;
    std::cout << "index = " << index << std::endl;
    std::cout.flush();
    data->fMutexAccessElement.unlock();
#endif
    
    while (index < numelements)
    {
        
        int64_t iel = data->fElSequenceColor->operator[](index);
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "Computing element " << index;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
#ifdef PZ_LOG
        std::stringstream sout;
        sout << "Element " << index << " elapsed time ";
        TPZTimer timeforel(sout.str());
        timeforel.start();
#endif

        if (iel >= 0){
            TPZCompEl *el = cmesh->ElementVec()[iel];
#ifndef DRY_RUN
            el->CalcStiff(ek,ef);
#else
            TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(el);
            intel->InitializeElementMatrix(ek,ef);
#endif

            if(guiInterface) if(guiInterface->AmIKilled()){
                break;
            }
            
#ifndef DRY_RUN
            if(!el->HasDependency()) {
                
                ek.ComputeDestinationIndices();
                data->fStruct->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
                
#ifdef PZ_LOG
                if(loggerel.isDebugEnabled())
                {
                    std::stringstream sout;
                    ek.fMat.Print("Element stiffness matrix",sout);
                    ef.fMat.Print("Element right hand side", sout);
                    LOGPZ_DEBUG(loggerel,sout.str())
                }
#endif
            } else {
                // the element has dependent nodes
                ek.ApplyConstraints();
                ef.ApplyConstraints();
                ek.ComputeDestinationIndices();
                data->fStruct->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
            }
#endif
            
#ifdef PZ_LOG
            timeforel.stop();
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << timeforel.processName() <<  timeforel;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif

            int64_t localcompleted = *(data->fElementCompleted);
            bool localupdated = false;
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            int64_t needscomputed = ElBlocked[index];
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                if (localupdated) {
                    sout << "Localcompleted updated without thread lock\n";
                }
                
                sout << "Element " << index << " is computed and can assemble if required " << needscomputed << " is smaller than localcompleted " << localcompleted;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            
#ifdef HUGEDEBUG
            data->fMutexAccessElement.lock();
            std::cout << "threadEK " << data->fThreadSeqNum << " index " << index << " localcompleted " << localcompleted << " needscomputed " << needscomputed << std::endl;
            data->fMutexAccessElement.unlock();
#endif
            
            bool hadtowait = false;
            while (needscomputed > localcompleted) {
                // block the thread till the element needed has been assembled
              std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
                SomeoneIsSleeping = 1;
                hadtowait = true;
#ifdef HUGEDEBUG
                std::cout << "threadEK " <<data->fThreadSeqNum << " Index " << index << " going to sleep waiting for " << needscomputed << std::endl;
                std::cout.flush();
#endif
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Element " << index << " cannot be assembled - going to sleep";
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                data->fConditionVar.wait(lock);
                
                localcompleted = *data->fElementCompleted;
                localupdated = false;
                while (ComputedElements[localcompleted+1] == 1) {
                    localcompleted++;
                    localupdated = true;
                }
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "thread wakeup for element index " << index << std::endl;
                    if (localupdated) {
                        sout << "Localcompleted updated without thread lock\n";
                    }
                    
                    sout << "Element " << index << " is computed and can assemble if required " << needscomputed << " is smaller than localcompleted " << localcompleted;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
            }
            
#ifdef HUGEDEBUG
            if (hadtowait) {
              std::scoped_lock lock(data->fMutexAccessElement);
                std::cout << "threadEK " <<data->fThreadSeqNum << " Index " << index << " continuing\n";
            }
#endif
            
#ifndef DRY_RUN
            auto globMatrix =
                    dynamic_cast<TPZMatrix<TVar> *>(data->fGlobMatrix);
                auto globRhs =
                    dynamic_cast<TPZFMatrix<TVar> *>(data->fGlobRhs);
            if(globMatrix){
                // Assemble the matrix
                if(!ek.HasDependency())
                {
                    globMatrix->AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
                    if(data->fComputeRhs) globRhs->AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
                }
                else
                {
                    globMatrix->AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
                    if(data->fComputeRhs)globRhs->AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
                }
                
            }
#endif
            
            localupdated = false;
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            if (localcompleted == index-1) {
                localcompleted++;
            }
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            bool elementcompletedupdate = false;
            if (*data->fElementCompleted < localcompleted) {
//                std::cout << "Updating element completed " << localcompleted << std::endl;
                *data->fElementCompleted = localcompleted;
                elementcompletedupdate = true;
            }
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Element " << index << " has been assembled ";
                if (localupdated) {
                    sout << "\nLocalcompleted updated without thread lock\n";
                }
                if (elementcompletedupdate) {
                    sout << "\nfElementCompleted updated to localcompleted\n";
                }
                sout << "local completed " << localcompleted;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            ComputedElements[index] = 1;
            if (SomeoneIsSleeping) {
              std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
#ifdef HUGEDEBUG
                std::cout << "threadEK " <<data->fThreadSeqNum <<  " Computed index " << index << " Waking up ElementsCompleted " << *data->fElementCompleted << std::endl;
                std::cout.flush();
#endif
                
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    LOGPZ_DEBUG(logger, "condition broadcast")
                }
#endif
                SomeoneIsSleeping = 0;
                data->fConditionVar.notify_all();
            }

        }
        else
        {
            std::cout << "the element in ElColorSequence is negative???\n";
            DebugStop();
        }
        index = data->fCurrentIndex->fetch_add(1);
        
    }
    // just make sure threads that were accidentally blocked get woken up
    std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
    bool localupdated = false;
    int64_t localcompleted = *(data->fElementCompleted);
    while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
        localcompleted++;
        localupdated = true;
    }
    if (localcompleted == index-1) {
        localcompleted++;
    }
    bool elementcompletedupdate = false;
    if (*data->fElementCompleted < localcompleted) {
        //                std::cout << "Updating element completed " << localcompleted << std::endl;
        *data->fElementCompleted = localcompleted;
        elementcompletedupdate = true;
    }

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        LOGPZ_DEBUG(logger, "Finishing up")
        if (localupdated) {
            LOGPZ_DEBUG(logger, "updated localcompleted")
        }
        if (elementcompletedupdate) {
            LOGPZ_DEBUG(logger, "updated fElementCompleted")
        }
        if (localupdated || elementcompletedupdate) {
            std::stringstream sout;
            sout << "localcompleted " << localcompleted;
            LOGPZ_DEBUG(logger, sout.str())
        }
        LOGPZ_DEBUG(logger, "finishing and condition broadcast")
    }
#endif
    data->fConditionVar.notify_all();
    SomeoneIsSleeping = 0;
    return 0;
}